

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

void enet_peer_reset_queues(ENetPeer *peer)

{
  void *memory;
  ENetChannel *local_18;
  ENetChannel *channel;
  ENetPeer *peer_local;
  
  if ((peer->flags & 1) != 0) {
    enet_list_remove(&peer->dispatchList);
    peer->flags = peer->flags & 0xfffe;
  }
  while ((peer->acknowledgements).sentinel.next != &(peer->acknowledgements).sentinel) {
    memory = enet_list_remove((peer->acknowledgements).sentinel.next);
    enet_free(memory);
  }
  enet_peer_reset_outgoing_commands(&peer->sentReliableCommands);
  enet_peer_reset_outgoing_commands(&peer->sentUnreliableCommands);
  enet_peer_reset_outgoing_commands(&peer->outgoingCommands);
  enet_peer_reset_incoming_commands(&peer->dispatchedCommands);
  if ((peer->channels != (ENetChannel *)0x0) && (peer->channelCount != 0)) {
    for (local_18 = peer->channels; local_18 < peer->channels + peer->channelCount;
        local_18 = local_18 + 1) {
      enet_peer_reset_incoming_commands(&local_18->incomingReliableCommands);
      enet_peer_reset_incoming_commands(&local_18->incomingUnreliableCommands);
    }
    enet_free(peer->channels);
  }
  peer->channels = (ENetChannel *)0x0;
  peer->channelCount = 0;
  return;
}

Assistant:

void
enet_peer_reset_queues (ENetPeer * peer)
{
    ENetChannel * channel;

    if (peer -> flags & ENET_PEER_FLAG_NEEDS_DISPATCH)
    {
       enet_list_remove (& peer -> dispatchList);

       peer -> flags &= ~ ENET_PEER_FLAG_NEEDS_DISPATCH;
    }

    while (! enet_list_empty (& peer -> acknowledgements))
      enet_free (enet_list_remove (enet_list_begin (& peer -> acknowledgements)));

    enet_peer_reset_outgoing_commands (& peer -> sentReliableCommands);
    enet_peer_reset_outgoing_commands (& peer -> sentUnreliableCommands);
    enet_peer_reset_outgoing_commands (& peer -> outgoingCommands);
    enet_peer_reset_incoming_commands (& peer -> dispatchedCommands);

    if (peer -> channels != NULL && peer -> channelCount > 0)
    {
        for (channel = peer -> channels;
             channel < & peer -> channels [peer -> channelCount];
             ++ channel)
        {
            enet_peer_reset_incoming_commands (& channel -> incomingReliableCommands);
            enet_peer_reset_incoming_commands (& channel -> incomingUnreliableCommands);
        }

        enet_free (peer -> channels);
    }

    peer -> channels = NULL;
    peer -> channelCount = 0;
}